

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_19::FieldValuePrinterWrapper::PrintInt32
          (FieldValuePrinterWrapper *this,int32_t val,BaseTextGenerator *generator)

{
  pointer pFVar1;
  string local_40;
  BaseTextGenerator *local_20;
  BaseTextGenerator *generator_local;
  FieldValuePrinterWrapper *pFStack_10;
  int32_t val_local;
  FieldValuePrinterWrapper *this_local;
  
  local_20 = generator;
  generator_local._4_4_ = val;
  pFStack_10 = this;
  pFVar1 = std::
           unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ::operator->(&this->delegate_);
  (*pFVar1->_vptr_FieldValuePrinter[3])(&local_40,pFVar1,(ulong)generator_local._4_4_);
  TextFormat::BaseTextGenerator::PrintString(generator,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void PrintInt32(int32_t val,
                  TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintInt32(val));
  }